

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O3

REF_STATUS ref_adapt_tattle_faces(REF_GRID ref_grid)

{
  long lVar1;
  uint node1;
  REF_DBL *pRVar2;
  uint uVar3;
  REF_STATUS RVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  REF_INT cell;
  int iVar13;
  REF_MPI pRVar14;
  REF_CELL ref_cell;
  bool bVar15;
  double dVar16;
  REF_DBL min_quality;
  REF_BOOL has_side;
  REF_DBL min_normdev;
  REF_DBL min_angle;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL ratio;
  REF_INT max_id;
  REF_DBL quality;
  REF_DBL normdev;
  REF_INT min_id;
  REF_BOOL geom_node;
  REF_DBL angle;
  REF_DBL dx1 [3];
  REF_INT nodes [27];
  double local_188;
  int local_17c;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  int local_14c;
  double local_148;
  ulong local_140;
  REF_MPI local_138;
  REF_GRID local_130;
  double local_128;
  REF_INT local_11c;
  uint local_118;
  int local_114;
  double local_110;
  double local_108;
  REF_NODE local_100;
  double local_f8;
  REF_GEOM local_f0;
  double local_e8 [4];
  double local_c8 [3];
  uint auStack_ac [31];
  
  pRVar14 = ref_grid->mpi;
  ref_cell = ref_grid->cell[3];
  uVar3 = ref_cell_id_range(ref_cell,pRVar14,(REF_INT *)&local_118,&local_14c);
  if (uVar3 == 0) {
    RVar4 = 0;
    uVar3 = local_118;
    local_138 = pRVar14;
    if ((int)local_118 <= local_14c) {
      do {
        uVar10 = (ulong)uVar3;
        local_188 = 1.0;
        if (0 < ref_cell->max) {
          iVar13 = 0;
          do {
            RVar4 = ref_cell_nodes(ref_cell,iVar13,(REF_INT *)(auStack_ac + 1));
            if ((RVar4 == 0) && (uVar3 == auStack_ac[(long)ref_cell->node_per + 1])) {
              uVar5 = ref_node_tri_quality(ref_grid->node,(REF_INT *)(auStack_ac + 1),&local_148);
              if (uVar5 != 0) {
                uVar10 = (ulong)uVar5;
                pcVar12 = "qual";
                uVar9 = 0x21c;
                goto LAB_001535a8;
              }
              if (local_148 <= local_188) {
                local_188 = local_148;
              }
            }
            iVar13 = iVar13 + 1;
            pRVar14 = local_138;
          } while (iVar13 < ref_cell->max);
        }
        local_148 = local_188;
        uVar3 = ref_mpi_min(pRVar14,&local_148,&local_188,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "min";
          uVar9 = 0x220;
          goto LAB_001535a8;
        }
        uVar3 = ref_mpi_bcast(pRVar14,&local_148,1,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "min";
          uVar9 = 0x221;
          goto LAB_001535a8;
        }
        local_178 = 2.0;
        local_170 = 90.0;
        if (((ref_grid->geom->model != (void *)0x0) || (ref_grid->geom->meshlink != (void *)0x0)) &&
           (ref_cell = ref_grid->cell[3], 0 < ref_cell->max)) {
          cell = 0;
          local_140 = uVar10;
          local_130 = ref_grid;
          do {
            RVar4 = ref_cell_nodes(ref_cell,cell,(REF_INT *)(auStack_ac + 1));
            if ((RVar4 == 0) && ((uint)uVar10 == auStack_ac[(long)ref_cell->node_per + 1])) {
              uVar3 = ref_geom_tri_norm_deviation(ref_grid,(REF_INT *)(auStack_ac + 1),&local_128);
              if (uVar3 != 0) {
                uVar10 = (ulong)uVar3;
                pcVar12 = "norm dev";
                uVar9 = 0x22a;
                goto LAB_001535a8;
              }
              if (local_128 <= local_178) {
                local_178 = local_128;
              }
              local_100 = ref_grid->node;
              local_f0 = ref_grid->geom;
              lVar11 = 0;
              local_11c = cell;
              do {
                uVar3 = auStack_ac[lVar11 + 1];
                uVar5 = ref_geom_is_a(local_f0,uVar3,0,&local_114);
                if (uVar5 != 0) {
                  uVar10 = (ulong)uVar5;
                  pcVar12 = "geom node check";
                  uVar9 = 0x1eb;
LAB_00153d7d:
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                         ,uVar9,"ref_adapt_min_sliver_angle",uVar10,pcVar12);
                  pcVar12 = "sliver angle";
                  uVar9 = 0x22d;
                  goto LAB_001535a8;
                }
                lVar1 = lVar11 + 1;
                if (local_114 != 0) {
                  lVar7 = lVar1;
                  if (lVar11 == 2) {
                    lVar7 = 0;
                  }
                  lVar8 = (long)((int)lVar11 + -1);
                  uVar5 = auStack_ac[lVar7 + 1];
                  if (lVar11 == 0) {
                    lVar8 = 2;
                  }
                  node1 = auStack_ac[lVar8 + 1];
                  uVar6 = ref_cell_has_side(local_130->cell[0],uVar3,uVar5,&local_17c);
                  if (uVar6 == 0) {
                    if (local_17c == 0) goto LAB_00153977;
                    uVar6 = ref_cell_has_side(local_130->cell[0],uVar3,node1,&local_17c);
                    if (uVar6 == 0) {
                      if (local_17c == 0) goto LAB_00153977;
                      pRVar2 = local_100->real;
                      lVar11 = 0;
                      do {
                        local_c8[lVar11] =
                             pRVar2[(long)(int)uVar5 * 0xf + lVar11] -
                             pRVar2[(long)(int)uVar3 * 0xf + lVar11];
                        local_e8[lVar11] =
                             pRVar2[(long)(int)node1 * 0xf + lVar11] -
                             pRVar2[(long)(int)uVar3 * 0xf + lVar11];
                        lVar11 = lVar11 + 1;
                      } while (lVar11 != 3);
                      uVar3 = ref_math_normalize(local_c8);
                      if (uVar3 == 0) {
                        uVar3 = ref_math_normalize(local_e8);
                        if (uVar3 == 0) {
                          local_108 = local_c8[2] * local_e8[2] +
                                      local_c8[0] * local_e8[0] + local_c8[1] * local_e8[1];
                          local_f8 = local_170;
                          dVar16 = acos(local_108);
                          if ((dVar16 * 180.0) / 3.14159265358979 <= local_f8) {
                            dVar16 = acos(local_108);
                            local_170 = (dVar16 * 180.0) / 3.14159265358979;
                          }
                          goto LAB_00153977;
                        }
                        uVar10 = (ulong)uVar3;
                        pcVar12 = "dx2";
                        uVar9 = 0x200;
                      }
                      else {
                        uVar10 = (ulong)uVar3;
                        pcVar12 = "dx1";
                        uVar9 = 0x1ff;
                      }
                    }
                    else {
                      uVar10 = (ulong)uVar6;
                      pcVar12 = "has edge node-node2";
                      uVar9 = 0x1f7;
                    }
                  }
                  else {
                    uVar10 = (ulong)uVar6;
                    pcVar12 = "has edge node-node1";
                    uVar9 = 500;
                  }
                  goto LAB_00153d7d;
                }
LAB_00153977:
                uVar10 = local_140;
                ref_grid = local_130;
                lVar11 = lVar1;
                cell = local_11c;
              } while (lVar1 != 3);
            }
            cell = cell + 1;
          } while (cell < ref_cell->max);
        }
        pRVar14 = local_138;
        local_128 = local_178;
        uVar3 = ref_mpi_min(local_138,&local_128,&local_178,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "mpi max";
          uVar9 = 0x231;
          goto LAB_001535a8;
        }
        uVar3 = ref_mpi_bcast(pRVar14,&local_178,1,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "min";
          uVar9 = 0x232;
          goto LAB_001535a8;
        }
        local_110 = local_170;
        uVar3 = ref_mpi_min(pRVar14,&local_110,&local_170,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "mpi max";
          uVar9 = 0x234;
          goto LAB_001535a8;
        }
        uVar3 = ref_mpi_bcast(pRVar14,&local_170,1,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "min";
          uVar9 = 0x235;
          goto LAB_001535a8;
        }
        local_160 = 1e+200;
        local_168 = -1e+200;
        if (0 < ref_cell->max) {
          iVar13 = 0;
          local_140 = uVar10;
          do {
            RVar4 = ref_cell_nodes(ref_cell,iVar13,(REF_INT *)(auStack_ac + 1));
            if ((RVar4 == 0) && ((uint)uVar10 == auStack_ac[(long)ref_cell->node_per + 1])) {
              lVar11 = 0;
              do {
                bVar15 = lVar11 != 2;
                lVar1 = lVar11 + 1;
                lVar11 = lVar11 + 1;
                lVar7 = 0;
                if (bVar15) {
                  lVar7 = lVar11;
                }
                uVar3 = ref_node_ratio(ref_grid->node,auStack_ac[lVar1],auStack_ac[lVar7 + 1],
                                       &local_158);
                if (uVar3 != 0) {
                  uVar10 = (ulong)uVar3;
                  pcVar12 = "rat";
                  uVar9 = 0x241;
                  goto LAB_001535a8;
                }
                if (local_158 <= local_160) {
                  local_160 = local_158;
                }
                if (local_168 <= local_158) {
                  local_168 = local_158;
                }
              } while (lVar11 != 3);
              uVar10 = local_140;
              if (local_148 <= local_188) {
                local_188 = local_148;
              }
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < ref_cell->max);
        }
        pRVar14 = local_138;
        local_158 = local_160;
        uVar3 = ref_mpi_min(local_138,&local_158,&local_160,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "mpi min";
          uVar9 = 0x248;
          goto LAB_001535a8;
        }
        uVar3 = ref_mpi_bcast(pRVar14,&local_160,1,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "min";
          uVar9 = 0x249;
          goto LAB_001535a8;
        }
        local_158 = local_168;
        uVar3 = ref_mpi_max(pRVar14,&local_158,&local_168,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "mpi max";
          uVar9 = 0x24b;
          goto LAB_001535a8;
        }
        uVar3 = ref_mpi_bcast(pRVar14,&local_168,1,3);
        if (uVar3 != 0) {
          uVar10 = (ulong)uVar3;
          pcVar12 = "max";
          uVar9 = 0x24c;
          goto LAB_001535a8;
        }
        if ((pRVar14->id == 0) &&
           ((((local_188 < 0.1 || (local_160 < 0.1)) || (4.0 < local_168)) || (local_178 < 0.5)))) {
          printf("face%6d quality %6.4f ratio %6.4f %6.2f normdev %6.4f topo angle %5.2f\n",
                 uVar10 & 0xffffffff);
        }
        RVar4 = 0;
        uVar3 = (int)uVar10 + 1;
      } while ((int)uVar10 < local_14c);
    }
  }
  else {
    uVar10 = (ulong)uVar3;
    pcVar12 = "id range";
    uVar9 = 0x216;
LAB_001535a8:
    RVar4 = (REF_STATUS)uVar10;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",uVar9,
           "ref_adapt_tattle_faces",uVar10,pcVar12);
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_tattle_faces(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL quality, min_quality;
  REF_DBL normdev, min_normdev;
  REF_DBL ratio, min_ratio, max_ratio;
  REF_DBL angle, min_angle;
  REF_INT edge, n0, n1;
  REF_INT id, min_id, max_id;

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_id_range(ref_cell, ref_mpi, &min_id, &max_id), "id range");
  for (id = min_id; id <= max_id; id++) {
    min_quality = 1.0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      RSS(ref_node_tri_quality(ref_grid_node(ref_grid), nodes, &quality),
          "qual");
      min_quality = MIN(min_quality, quality);
    }
    quality = min_quality;
    RSS(ref_mpi_min(ref_mpi, &quality, &min_quality, REF_DBL_TYPE), "min");
    RSS(ref_mpi_bcast(ref_mpi, &quality, 1, REF_DBL_TYPE), "min");

    min_normdev = 2.0;
    min_angle = 90.0;
    if (ref_geom_model_loaded(ref_grid_geom(ref_grid)) ||
        ref_geom_meshlinked(ref_grid_geom(ref_grid))) {
      ref_cell = ref_grid_tri(ref_grid);
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
        RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
        min_normdev = MIN(min_normdev, normdev);
        RSS(ref_adapt_min_sliver_angle(ref_grid, nodes, &min_angle),
            "sliver angle");
      }
    }
    normdev = min_normdev;
    RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");
    angle = min_angle;
    RSS(ref_mpi_min(ref_mpi, &angle, &min_angle, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_angle, 1, REF_DBL_TYPE), "min");

    min_ratio = REF_DBL_MAX;
    max_ratio = REF_DBL_MIN;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      for (edge = 0; edge < 3; edge++) {
        n0 = edge;
        n1 = edge + 1;
        if (n1 > 2) n1 -= 3;
        RSS(ref_node_ratio(ref_grid_node(ref_grid), nodes[n0], nodes[n1],
                           &ratio),
            "rat");
        min_ratio = MIN(min_ratio, ratio);
        max_ratio = MAX(max_ratio, ratio);
      }
      min_quality = MIN(min_quality, quality);
    }
    ratio = min_ratio;
    RSS(ref_mpi_min(ref_mpi, &ratio, &min_ratio, REF_DBL_TYPE), "mpi min");
    RSS(ref_mpi_bcast(ref_mpi, &min_ratio, 1, REF_DBL_TYPE), "min");
    ratio = max_ratio;
    RSS(ref_mpi_max(ref_mpi, &ratio, &max_ratio, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_ratio, 1, REF_DBL_TYPE), "max");

    if (ref_mpi_once(ref_mpi)) {
      if (min_quality < 0.1 || min_ratio < 0.1 || max_ratio > 4.0 ||
          min_normdev < 0.5) {
        printf(
            "face%6d quality %6.4f ratio %6.4f %6.2f normdev %6.4f"
            " topo angle %5.2f\n",
            id, min_quality, min_ratio, max_ratio, min_normdev, angle);
      }
    }
  }

  return REF_SUCCESS;
}